

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

function<void_(BaseSocket_*)> * __thiscall
BaseSocket::BindErrorFunction
          (function<void_(BaseSocket_*)> *__return_storage_ptr__,BaseSocket *this,
          function<void_(BaseSocket_*)> *fError)

{
  BaseSocketImpl *pBVar1;
  function<void_(BaseSocket_*)> local_40;
  function<void_(BaseSocket_*)> *local_20;
  function<void_(BaseSocket_*)> *fError_local;
  BaseSocket *this_local;
  
  local_20 = fError;
  fError_local = (function<void_(BaseSocket_*)> *)this;
  this_local = (BaseSocket *)__return_storage_ptr__;
  pBVar1 = GetImpl(this);
  std::function<void_(BaseSocket_*)>::function(&local_40,fError);
  (*pBVar1->_vptr_BaseSocketImpl[3])(__return_storage_ptr__,pBVar1,&local_40);
  std::function<void_(BaseSocket_*)>::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::function<void(BaseSocket*)> BaseSocket::BindErrorFunction(std::function<void(BaseSocket*)> fError)
{
    return GetImpl()->BindErrorFunction(fError);
}